

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

void AddPathEnvVars(void)

{
  int local_1c;
  char *pcStack_18;
  int dirname_length;
  char *path;
  int length;
  
  path._4_4_ = wai_getExecutablePath((char *)0x0,0,(int *)0x0);
  pcStack_18 = (char *)malloc((long)(path._4_4_ + 1));
  wai_getExecutablePath(pcStack_18,path._4_4_,&local_1c);
  pcStack_18[local_1c] = '\0';
  setEnvVar("MS_EXE_DIR",pcStack_18);
  return;
}

Assistant:

void AddPathEnvVars() {
	int length = wai_getExecutablePath(nullptr, 0, nullptr);
	char* path = (char*)malloc(length + 1);
	int dirname_length;
	wai_getExecutablePath(path, length, &dirname_length);
	path[dirname_length] = '\0';
	setEnvVar("MS_EXE_DIR", path);
}